

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O0

TextureFormat glu::mapGLInternalFormat(deUint32 internalFormat)

{
  InternalError *this;
  deUint64 local_b8;
  string local_b0;
  allocator<char> local_79;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  deUint32 local_14;
  TextureFormat TStack_10;
  deUint32 internalFormat_local;
  
  local_14 = internalFormat;
  if (internalFormat == 0x8051) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT8);
  }
  else if (internalFormat == 0x8052) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT_1010102_REV);
  }
  else if (internalFormat == 0x8054) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_INT16);
  }
  else if (internalFormat == 0x8056) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_SHORT_4444);
  }
  else if (internalFormat == 0x8057) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_SHORT_5551);
  }
  else if (internalFormat == 0x8058) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT8);
  }
  else if (internalFormat == 0x8059) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT_1010102_REV);
  }
  else if (internalFormat == 0x805b) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNORM_INT16);
  }
  else if (internalFormat == 0x81a5) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,UNORM_INT16);
  }
  else if (internalFormat == 0x81a6) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,UNSIGNED_INT_24_8);
  }
  else if (internalFormat == 0x81a7) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,UNSIGNED_INT32);
  }
  else if (internalFormat == 0x8229) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNORM_INT8);
  }
  else if (internalFormat == 0x822a) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNORM_INT16);
  }
  else if (internalFormat == 0x822b) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_INT8);
  }
  else if (internalFormat == 0x822c) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNORM_INT16);
  }
  else if (internalFormat == 0x822d) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,HALF_FLOAT);
  }
  else if (internalFormat == 0x822e) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,FLOAT);
  }
  else if (internalFormat == 0x822f) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,HALF_FLOAT);
  }
  else if (internalFormat == 0x8230) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,FLOAT);
  }
  else if (internalFormat == 0x8231) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT8);
  }
  else if (internalFormat == 0x8232) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT8);
  }
  else if (internalFormat == 0x8233) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT16);
  }
  else if (internalFormat == 0x8234) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT16);
  }
  else if (internalFormat == 0x8235) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SIGNED_INT32);
  }
  else if (internalFormat == 0x8236) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,UNSIGNED_INT32);
  }
  else if (internalFormat == 0x8237) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT8);
  }
  else if (internalFormat == 0x8238) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT8);
  }
  else if (internalFormat == 0x8239) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT16);
  }
  else if (internalFormat == 0x823a) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT16);
  }
  else if (internalFormat == 0x823b) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SIGNED_INT32);
  }
  else if (internalFormat == 0x823c) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,UNSIGNED_INT32);
  }
  else if (internalFormat == 0x8814) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,FLOAT);
  }
  else if (internalFormat == 0x8815) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,FLOAT);
  }
  else if (internalFormat == 0x881a) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,HALF_FLOAT);
  }
  else if (internalFormat == 0x881b) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,HALF_FLOAT);
  }
  else if (internalFormat == 0x88f0) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,DS,UNSIGNED_INT_24_8);
  }
  else if (internalFormat == 0x8c3a) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT_11F_11F_10F_REV);
  }
  else if (internalFormat == 0x8c3d) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT_999_E5_REV);
  }
  else if (internalFormat == 0x8c41) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGB,UNORM_INT8);
  }
  else if (internalFormat == 0x8c43) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRGBA,UNORM_INT8);
  }
  else if (internalFormat == 0x8cac) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,D,FLOAT);
  }
  else if (internalFormat == 0x8cad) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,DS,FLOAT_UNSIGNED_INT_24_8_REV);
  }
  else if (internalFormat == 0x8d48) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,S,UNSIGNED_INT8);
  }
  else if (internalFormat == 0x8d62) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNORM_SHORT_565);
  }
  else if (internalFormat == 0x8d70) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT32);
  }
  else if (internalFormat == 0x8d71) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT32);
  }
  else if (internalFormat == 0x8d76) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT16);
  }
  else if (internalFormat == 0x8d77) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT16);
  }
  else if (internalFormat == 0x8d7c) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT8);
  }
  else if (internalFormat == 0x8d7d) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,UNSIGNED_INT8);
  }
  else if (internalFormat == 0x8d82) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT32);
  }
  else if (internalFormat == 0x8d83) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT32);
  }
  else if (internalFormat == 0x8d88) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT16);
  }
  else if (internalFormat == 0x8d89) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT16);
  }
  else if (internalFormat == 0x8d8e) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SIGNED_INT8);
  }
  else if (internalFormat == 0x8d8f) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SIGNED_INT8);
  }
  else if (internalFormat == 0x8f94) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SNORM_INT8);
  }
  else if (internalFormat == 0x8f95) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SNORM_INT8);
  }
  else if (internalFormat == 0x8f96) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SNORM_INT8);
  }
  else if (internalFormat == 0x8f97) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT8);
  }
  else if (internalFormat == 0x8f98) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,R,SNORM_INT16);
  }
  else if (internalFormat == 0x8f99) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RG,SNORM_INT16);
  }
  else if (internalFormat == 0x8f9a) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGB,SNORM_INT16);
  }
  else if (internalFormat == 0x8f9b) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,SNORM_INT16);
  }
  else if (internalFormat == 0x8fbd) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sR,UNORM_INT8);
  }
  else if (internalFormat == 0x8fbe) {
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,sRG,UNORM_INT8);
  }
  else {
    if (internalFormat != 0x906f) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"Can\'t map GL sized internal format (",&local_79);
      local_b8 = (deUint64)tcu::toHex<unsigned_int>(local_14);
      tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_b0,&local_b8);
      std::operator+(&local_58,&local_78,&local_b0);
      std::operator+(&local_38,&local_58,") to texture format");
      tcu::InternalError::InternalError(this,&local_38);
      __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::InternalError::~InternalError);
    }
    tcu::TextureFormat::TextureFormat(&stack0xfffffffffffffff0,RGBA,UNSIGNED_INT_1010102_REV);
  }
  return TStack_10;
}

Assistant:

tcu::TextureFormat mapGLInternalFormat (deUint32 internalFormat)
{
	using tcu::TextureFormat;
	switch (internalFormat)
	{
		case GL_RGB5_A1:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_5551);
		case GL_RGBA4:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_4444);
		case GL_RGB565:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_SHORT_565);
		case GL_DEPTH_COMPONENT16:	return TextureFormat(TextureFormat::D,		TextureFormat::UNORM_INT16);
		case GL_STENCIL_INDEX8:		return TextureFormat(TextureFormat::S,		TextureFormat::UNSIGNED_INT8);

		case GL_RGBA32F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT);
		case GL_RGBA32I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT32);
		case GL_RGBA32UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT32);
		case GL_RGBA16:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT16);
		case GL_RGBA16_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT16);
		case GL_RGBA16F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::HALF_FLOAT);
		case GL_RGBA16I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case GL_RGBA16UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case GL_RGBA8:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case GL_RGBA8I:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case GL_RGBA8UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8_ALPHA8:		return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
		case GL_RGB10_A2:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT_1010102_REV);
		case GL_RGB10_A2UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case GL_RGBA8_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);

		case GL_RGB8:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_R11F_G11F_B10F:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_11F_11F_10F_REV);
		case GL_RGB32F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT);
		case GL_RGB32I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT32);
		case GL_RGB32UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT32);
		case GL_RGB16:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT16);
		case GL_RGB16_SNORM:		return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT16);
		case GL_RGB16F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::HALF_FLOAT);
		case GL_RGB16I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case GL_RGB16UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case GL_RGB8_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT8);
		case GL_RGB8I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case GL_RGB8UI:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8:				return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);
		case GL_RGB9_E5:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_999_E5_REV);
		case GL_RGB10:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT_1010102_REV);

		case GL_RG32F:				return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT);
		case GL_RG32I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT32);
		case GL_RG32UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT32);
		case GL_RG16:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
		case GL_RG16_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
		case GL_RG16F:				return TextureFormat(TextureFormat::RG,		TextureFormat::HALF_FLOAT);
		case GL_RG16I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case GL_RG16UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case GL_RG8:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT8);
		case GL_RG8I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case GL_RG8UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case GL_RG8_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT8);
		case GL_SRG8_EXT:			return TextureFormat(TextureFormat::sRG,	TextureFormat::UNORM_INT8);

		case GL_R32F:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT);
		case GL_R32I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT32);
		case GL_R32UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT32);
		case GL_R16:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
		case GL_R16_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
		case GL_R16F:				return TextureFormat(TextureFormat::R,		TextureFormat::HALF_FLOAT);
		case GL_R16I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case GL_R16UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case GL_R8:					return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT8);
		case GL_R8I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case GL_R8UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case GL_R8_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT8);
		case GL_SR8_EXT:			return TextureFormat(TextureFormat::sR,		TextureFormat::UNORM_INT8);

		case GL_DEPTH_COMPONENT32F:	return TextureFormat(TextureFormat::D,		TextureFormat::FLOAT);
		case GL_DEPTH_COMPONENT24:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT_24_8);
		case GL_DEPTH_COMPONENT32:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT32);
		case GL_DEPTH32F_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV);
		case GL_DEPTH24_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_24_8);

		default:
			throw tcu::InternalError(string("Can't map GL sized internal format (") + tcu::toHex(internalFormat).toString() + ") to texture format");
	}
}